

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

void Persistent_Test_Hitter<8u>(string *PATH)

{
  bool bVar1;
  value_type pbVar2;
  reference ppbVar3;
  OO_FPI<8U> *this;
  void *memory_00;
  void *pvVar4;
  void *pvVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  reference ppbVar8;
  basic_ostream<char,_std::char_traits<char>_> **out_3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2_1;
  int j_4;
  int j_3;
  ofstream out;
  int j_2;
  int j_1;
  uint time;
  uint num;
  Data<8U> packet;
  HashMap<8U> cycle;
  HashMap<8U> mp;
  basic_ostream<char,_std::char_traits<char>_> **out_2;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  uint32_t j;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  iterator __end3;
  iterator __begin3;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range3;
  Abstract<8U> *sketch [4];
  int memory;
  int SKETCH_NUM;
  int i;
  Data<8U> *records;
  int cnt;
  string file;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
  *in_stack_fffffffffffff9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c8;
  allocator_type *in_stack_fffffffffffff9d0;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> in_stack_fffffffffffff9d8;
  Small_Space<8U> *in_stack_fffffffffffff9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e8;
  ostream *in_stack_fffffffffffffa00;
  ostream *in_stack_fffffffffffffa08;
  WavingSketch<8U,_16U,_8U> *in_stack_fffffffffffffa10;
  int *cnt_00;
  undefined8 in_stack_fffffffffffffa78;
  int iVar9;
  char *in_stack_fffffffffffffa80;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_578;
  undefined1 *local_570;
  int local_568;
  int local_564;
  undefined1 local_560 [512];
  undefined1 local_360 [56];
  int local_328;
  int local_324;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_320;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_318;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_310;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_308;
  int local_300;
  uint local_2fc;
  Data<8U> local_2f8 [15];
  reference local_280;
  basic_ostream<char,_std::char_traits<char>_> **local_278;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_270;
  undefined1 *local_268;
  uint local_25c;
  reference local_258;
  basic_ostream<char,_std::char_traits<char>_> **local_250;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_248;
  undefined1 *local_240;
  void *local_238 [3];
  WavingSketch<8U,_16U,_8U> *local_220;
  int local_214;
  undefined4 local_210;
  int local_20c;
  Data<8U> *local_208;
  uint local_200;
  undefined1 local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [39];
  undefined1 local_191;
  string local_190 [32];
  string local_170 [32];
  string local_150 [39];
  undefined1 local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [39];
  undefined1 local_c1;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [39];
  allocator local_59;
  string local_58 [55];
  undefined1 local_21 [33];
  
  iVar9 = (int)((ulong)in_stack_fffffffffffffa78 >> 0x20);
  cnt_00 = (int *)local_21;
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10d96c);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            *)in_stack_fffffffffffff9e0,(size_type)in_stack_fffffffffffff9d8._M_cur,
           in_stack_fffffffffffff9d0);
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::~allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10d995);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"caida",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pbVar2 = (value_type)operator_new(0x200);
  local_c1 = 1;
  std::operator+(in_stack_fffffffffffff9e8,(char *)in_stack_fffffffffffff9e0);
  std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
  std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  std::ofstream::ofstream(pbVar2,local_80,0x10);
  local_c1 = 0;
  ppbVar3 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)(local_21 + 1),0);
  *ppbVar3 = pbVar2;
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  pbVar2 = (value_type)operator_new(0x200);
  local_129 = 1;
  std::operator+(in_stack_fffffffffffff9e8,(char *)in_stack_fffffffffffff9e0);
  std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
  std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  std::ofstream::ofstream(pbVar2,local_e8,0x10);
  local_129 = 0;
  ppbVar3 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)(local_21 + 1),1);
  *ppbVar3 = pbVar2;
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  pbVar2 = (value_type)operator_new(0x200);
  local_191 = 1;
  std::operator+(in_stack_fffffffffffff9e8,(char *)in_stack_fffffffffffff9e0);
  std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
  std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  std::ofstream::ofstream(pbVar2,local_150,0x10);
  local_191 = 0;
  ppbVar3 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)(local_21 + 1),2);
  *ppbVar3 = pbVar2;
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  pbVar2 = (value_type)operator_new(0x200);
  local_1f9 = 1;
  std::operator+(in_stack_fffffffffffff9e8,(char *)in_stack_fffffffffffff9e0);
  std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
  std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
  std::ofstream::ofstream(pbVar2,local_1b8,0x10);
  local_1f9 = 0;
  ppbVar3 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)(local_21 + 1),3);
  *ppbVar3 = pbVar2;
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::c_str();
  local_208 = read_standard_data<8u>(in_stack_fffffffffffffa80,iVar9,cnt_00);
  this = (OO_FPI<8U> *)std::min<int>((int *)&local_200,&MAX_PACKET);
  local_200 = *(uint *)&(this->super_Abstract<8U>)._vptr_Abstract;
  for (local_20c = 0; local_20c < 5; local_20c = local_20c + 1) {
    local_210 = 4;
    local_214 = local_20c * 40000 + 40000;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",(ulong)(uint)(local_214 / 1000));
    memory_00 = operator_new(0xa8);
    WavingSketch<8U,_16U,_8U>::WavingSketch
              (in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
               (int)in_stack_fffffffffffffa08,(uint32_t)((ulong)in_stack_fffffffffffffa00 >> 0x20));
    local_238[0] = memory_00;
    pvVar4 = operator_new(0xb0);
    Small_Space<8U>::Small_Space
              (in_stack_fffffffffffff9e0,(int)((ulong)in_stack_fffffffffffff9d8._M_cur >> 0x20),
               (int)in_stack_fffffffffffff9d8._M_cur);
    local_238[1] = pvVar4;
    pvVar5 = operator_new(0x80);
    iVar9 = (int)((ulong)pvVar4 >> 0x20);
    PIE<8U>::PIE((PIE<8U> *)in_stack_fffffffffffff9e0,
                 (int)((ulong)in_stack_fffffffffffff9d8._M_cur >> 0x20),
                 (int)in_stack_fffffffffffff9d8._M_cur,
                 (uint)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
    local_238[2] = pvVar5;
    in_stack_fffffffffffffa10 = (WavingSketch<8U,_16U,_8U> *)operator_new(0x98);
    OO_FPI<8U>::OO_FPI(this,(uint64_t)memory_00,iVar9);
    local_220 = in_stack_fffffffffffffa10;
    if (local_20c == 0) {
      local_240 = local_21 + 1;
      local_248._M_current =
           (basic_ostream<char,_std::char_traits<char>_> **)
           std::
           vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    *)in_stack_fffffffffffff9b8);
      local_250 = (basic_ostream<char,_std::char_traits<char>_> **)
                  std::
                  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                         *)in_stack_fffffffffffff9b8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                 *)in_stack_fffffffffffff9c0,
                                (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                 *)in_stack_fffffffffffff9b8), bVar1) {
        local_258 = __gnu_cxx::
                    __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                    ::operator*(&local_248);
        in_stack_fffffffffffffa08 = std::operator<<((ostream *)*local_258,"MEM(KB)");
        std::operator<<(in_stack_fffffffffffffa08,",");
        for (local_25c = 0; local_25c < 4; local_25c = local_25c + 1) {
          in_stack_fffffffffffffa00 =
               std::operator<<((ostream *)*local_258,(string *)((long)local_238[local_25c] + 8));
          std::operator<<(in_stack_fffffffffffffa00,",");
        }
        std::ostream::operator<<((ostream *)*local_258,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
        ::operator++(&local_248);
      }
    }
    local_268 = local_21 + 1;
    local_270._M_current =
         (basic_ostream<char,_std::char_traits<char>_> **)
         std::
         vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
         ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  *)in_stack_fffffffffffff9b8);
    local_278 = (basic_ostream<char,_std::char_traits<char>_> **)
                std::
                vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                       *)in_stack_fffffffffffff9b8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                               *)in_stack_fffffffffffff9c0,
                              (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                               *)in_stack_fffffffffffff9b8), bVar1) {
      local_280 = __gnu_cxx::
                  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                  ::operator*(&local_270);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)*local_280,local_214 / 1000);
      std::operator<<(poVar6,",");
      __gnu_cxx::
      __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&local_270);
    }
    std::
    unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
    ::unordered_map((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                     *)0x10e4a4);
    std::
    unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
    ::unordered_map((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                     *)0x10e4b1);
    Data<8U>::Data((Data<8U> *)0x10e4be);
    local_2fc = 0;
    local_300 = 0;
    while (local_2fc < local_200) {
      Data<8U>::operator=(local_2f8,local_208 + local_2fc);
      if (local_2fc % 0x4c51 == 0) {
        local_300 = local_300 + 1;
        std::
        unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
        ::clear((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                 *)0x10e53f);
      }
      local_2fc = local_2fc + 1;
      local_308._M_cur =
           (__node_type *)
           std::
           unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
           ::find(in_stack_fffffffffffff9b8,(key_type *)0x10e57f);
      local_310._M_cur =
           (__node_type *)
           std::
           unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
           ::end(in_stack_fffffffffffff9b8);
      bVar1 = std::__detail::operator==(&local_308,&local_310);
      if (bVar1) {
        pmVar7 = std::
                 unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                 ::operator[]((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                               *)in_stack_fffffffffffff9c0,(key_type *)in_stack_fffffffffffff9b8);
        *pmVar7 = 1;
        in_stack_fffffffffffff9e0 =
             (Small_Space<8U> *)
             std::
             unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
             ::operator[]((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                           *)in_stack_fffffffffffff9c0,(key_type *)in_stack_fffffffffffff9b8);
        *(mapped_type *)
         &(((_Vector_impl *)&(in_stack_fffffffffffff9e0->super_Abstract<8U>)._vptr_Abstract)->
          super__Vector_impl_data)._M_start = 1;
      }
      else {
        in_stack_fffffffffffff9d8._M_cur =
             (__node_type *)
             std::
             unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
             ::find(in_stack_fffffffffffff9b8,(key_type *)0x10e62b);
        local_318._M_cur = in_stack_fffffffffffff9d8._M_cur;
        local_320._M_cur =
             (__node_type *)
             std::
             unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
             ::end(in_stack_fffffffffffff9b8);
        bVar1 = std::__detail::operator==(&local_318,&local_320);
        if (bVar1) {
          in_stack_fffffffffffff9d0 =
               (allocator_type *)
               std::
               unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
               ::operator[]((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                             *)in_stack_fffffffffffff9c0,(key_type *)in_stack_fffffffffffff9b8);
          *(mapped_type *)in_stack_fffffffffffff9d0 = 1;
          pmVar7 = std::
                   unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                   ::operator[]((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                                 *)in_stack_fffffffffffff9c0,(key_type *)in_stack_fffffffffffff9b8);
          *pmVar7 = *pmVar7 + 1;
        }
      }
      for (local_324 = 0; local_324 < 4; local_324 = local_324 + 1) {
        (**(code **)(*local_238[local_324] + 0x38))(local_238[local_324],local_2f8,local_300);
      }
    }
    for (local_328 = 0; local_328 < 4; local_328 = local_328 + 1) {
      in_stack_fffffffffffff9c0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238[local_328]
      ;
      std::
      unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
      ::unordered_map((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                       *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      (**(code **)(*(long *)in_stack_fffffffffffff9c0 + 0x30))
                (in_stack_fffffffffffff9c0,local_360,local_21 + 1);
      std::
      unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
      ::~unordered_map((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                        *)0x10e78b);
    }
    std::ofstream::ofstream(local_560);
    for (local_564 = 0; local_564 < 4; local_564 = local_564 + 1) {
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      Abstract<8U>::print_f1
                (&in_stack_fffffffffffff9e0->super_Abstract<8U>,
                 (ofstream *)in_stack_fffffffffffff9d8._M_cur,
                 (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
    }
    for (local_568 = 0; local_568 < 4; local_568 = local_568 + 1) {
      in_stack_fffffffffffff9b8 =
           (unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
            *)local_238[local_568];
      if (in_stack_fffffffffffff9b8 !=
          (unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
           *)0x0) {
        (*(code *)(in_stack_fffffffffffff9b8->_M_h)._M_buckets[9])();
      }
    }
    local_570 = local_21 + 1;
    local_578._M_current =
         (basic_ostream<char,_std::char_traits<char>_> **)
         std::
         vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
         ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  *)in_stack_fffffffffffff9b8);
    std::
    vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           *)in_stack_fffffffffffff9b8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                               *)in_stack_fffffffffffff9c0,
                              (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                               *)in_stack_fffffffffffff9b8), bVar1) {
      ppbVar8 = __gnu_cxx::
                __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                ::operator*(&local_578);
      std::ostream::operator<<((ostream *)*ppbVar8,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&local_578);
    }
    std::ofstream::~ofstream(local_560);
    std::
    unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
    ::~unordered_map((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                      *)0x10e955);
    std::
    unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
    ::~unordered_map((unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
                      *)0x10e962);
  }
  free(local_208);
  std::__cxx11::string::~string(local_58);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)in_stack_fffffffffffff9d0);
  return;
}

Assistant:

void Persistent_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(4);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_Recall Rate (RR).csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_Precision Rate (PR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_F1.csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_ARE.csv");
	int cnt;
	auto records = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
	cnt = std::min(cnt, MAX_PACKET);
	for (int i = 0; i < 5; ++i) {
		constexpr int SKETCH_NUM = 4;
		int memory = Persistent_BLOCK * (i + 1);
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new WavingSketch<8, 16, DATA_LEN>(memory, Persistent_HIT);
		sketch[1] = new Small_Space<DATA_LEN>(memory, Persistent_HIT);
		sketch[2] = new PIE<DATA_LEN>(memory * 200, Persistent_HIT, 1600);
		sketch[3] = new OO_FPI<DATA_LEN>(memory, Persistent_HIT);
		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}
		HashMap<DATA_LEN> mp;
		HashMap<DATA_LEN> cycle;
		Data<DATA_LEN> packet;
		uint num = 0;
		uint time = 0;
		// int t;

		while (num < cnt) {
			packet = records[num];
			if (num % 19537 == 0) {
				time += 1;
				cycle.clear();
			}
			num++;

			if (mp.find(packet) == mp.end()) {
				mp[packet] = 1;
				cycle[packet] = 1;
			}
			else if (cycle.find(packet) == cycle.end()) {
				cycle[packet] = 1;
				mp[packet] += 1;
			}

			for (int j = 0; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(packet, time);
			}
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			sketch[j]->Check(mp, outs);
		}

		ofstream out;

		for (int j = 0; j < SKETCH_NUM; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			delete sketch[j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
	free(records);
}